

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void test_resampler_duplex<float>
               (uint32_t input_channels,uint32_t output_channels,uint32_t input_rate,
               uint32_t output_rate,uint32_t target_rate,float chunk_duration)

{
  float *frames;
  float *name;
  uint in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  uint in_R8D;
  float in_XMM0_Da;
  float fVar1;
  double dVar2;
  long input_consumed;
  uint32_t leftover_samples;
  auto_array<float> expected_resampled_output;
  auto_array<float> expected_resampled_input;
  auto_array<float> output_buffer;
  auto_array<float> input_buffer;
  uint32_t output_array_frame_count;
  uint32_t input_array_frame_count;
  int32_t duration_frames;
  uint32_t duration_s;
  long latency;
  cubeb_resampler *resampler;
  long got;
  osc_state state;
  cubeb_stream_params output_params;
  cubeb_stream_params input_params;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  uint32_t initial_phase;
  uint32_t in_stack_fffffffffffffe84;
  auto_array<float> *in_stack_fffffffffffffe88;
  auto_array<float> *in_stack_fffffffffffffe90;
  auto_array<float> *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  uint uVar4;
  cubeb_stream_params *in_stack_fffffffffffffea8;
  cubeb_stream_params *in_stack_fffffffffffffeb0;
  cubeb_stream *in_stack_fffffffffffffeb8;
  cubeb_resampler_quality in_stack_fffffffffffffed0;
  cubeb_resampler_reclock in_stack_fffffffffffffed8;
  auto_array<float> local_118;
  auto_array<float> local_100;
  auto_array<float> local_e8;
  auto_array<float> local_d0;
  undefined4 local_b8;
  uint local_b4;
  int local_b0;
  undefined4 local_ac;
  long local_a8;
  cubeb_resampler *local_a0;
  long local_98;
  uint32_t local_90;
  int local_8c;
  int local_88;
  undefined4 local_80;
  undefined4 local_7c;
  uint local_78;
  uint local_74;
  auto_array<float> aStack_70;
  auto_array<float> aStack_58;
  cubeb_sample_format local_40;
  uint local_3c;
  undefined4 local_38;
  undefined4 local_30;
  cubeb_sample_format local_2c;
  uint local_28;
  undefined4 local_24;
  undefined4 local_1c;
  float local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  uVar4 = (uint)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  local_18 = in_XMM0_Da;
  local_14 = in_R8D;
  local_10 = in_ECX;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  osc_state::osc_state((osc_state *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_40 = cubeb_format<float>();
  local_24 = local_4;
  local_80 = local_4;
  local_38 = local_8;
  local_7c = local_8;
  local_28 = local_c;
  local_3c = local_10;
  local_78 = local_10;
  local_74 = local_14;
  local_30 = 0;
  local_1c = 0;
  initial_phase = 0;
  uVar3 = 0;
  local_2c = local_40;
  local_a0 = cubeb_resampler_create
                       (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffea8,uVar4,
                        (cubeb_data_callback)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                        in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
  local_a8 = cubeb_resampler_latency((cubeb_resampler *)0x10f1bb);
  local_ac = 2;
  local_b0 = local_14 * 2;
  dVar2 = ceil((double)((local_18 * (float)local_c) / 1000.0));
  fVar1 = ceilf((float)local_c / (float)local_14);
  local_b4 = (uint)(long)(dVar2 + (double)(fVar1 + fVar1));
  local_b8 = (undefined4)(long)((local_18 * (float)local_10) / 1000.0);
  auto_array<float>::auto_array
            (in_stack_fffffffffffffe90,(uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  auto_array<float>::auto_array
            (in_stack_fffffffffffffe90,(uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  auto_array<float>::auto_array
            (in_stack_fffffffffffffe90,(uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  auto_array<float>::auto_array
            (in_stack_fffffffffffffe90,(uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  local_8c = local_14 << 1;
  auto_array<float>::push_silence
            ((auto_array<float> *)CONCAT44(in_stack_fffffffffffffe84,initial_phase),
             CONCAT44(in_stack_fffffffffffffe7c,uVar3));
  auto_array<float>::push_silence
            ((auto_array<float> *)CONCAT44(in_stack_fffffffffffffe84,initial_phase),
             CONCAT44(in_stack_fffffffffffffe7c,uVar3));
  auto_array<float>::data(&local_100);
  fill_with_sine((float *)in_stack_fffffffffffffe90,
                 (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,initial_phase);
  auto_array<float>::data(&local_118);
  fill_with_sine((float *)in_stack_fffffffffffffe90,
                 (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,initial_phase);
  while (local_88 != local_8c) {
    auto_array<float>::length(&local_d0);
    auto_array<float>::reserve(in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
    auto_array<float>::data(&local_d0);
    local_90 = fill_with_sine((float *)in_stack_fffffffffffffe90,
                              (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                              (uint32_t)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                              initial_phase);
    uVar4 = local_b4;
    auto_array<float>::set_length(&local_d0,(ulong)local_b4);
    auto_array<float>::data(&local_d0);
    auto_array<float>::data(&local_e8);
    local_98 = cubeb_resampler_fill
                         ((cubeb_resampler *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          (long *)CONCAT44(in_stack_fffffffffffffe84,initial_phase),
                          (void *)CONCAT44(in_stack_fffffffffffffe7c,uVar3),0x10f4d5);
    if (local_b4 == uVar4) {
      auto_array<float>::clear(&local_d0);
    }
    else {
      auto_array<float>::pop
                (in_stack_fffffffffffffe88,
                 (float *)CONCAT44(in_stack_fffffffffffffe84,initial_phase),
                 CONCAT44(in_stack_fffffffffffffe7c,uVar3));
    }
    auto_array<float>::data(&local_e8);
    auto_array<float>::push
              (in_stack_fffffffffffffe90,(float *)in_stack_fffffffffffffe88,
               CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  }
  frames = auto_array<float>::data(&local_100);
  auto_array<float>::length(&local_100);
  dump<float>((char *)in_stack_fffffffffffffe90,frames,
              CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  name = auto_array<float>::data(&local_118);
  auto_array<float>::length(&local_118);
  dump<float>((char *)name,frames,CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  auto_array<float>::data(&aStack_70);
  auto_array<float>::length(&aStack_70);
  dump<float>((char *)name,frames,CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  auto_array<float>::data(&aStack_58);
  auto_array<float>::length(&aStack_58);
  dump<float>((char *)name,frames,CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  cubeb_resampler_destroy((cubeb_resampler *)CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  auto_array<float>::~auto_array
            ((auto_array<float> *)CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  auto_array<float>::~auto_array
            ((auto_array<float> *)CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  auto_array<float>::~auto_array
            ((auto_array<float> *)CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  auto_array<float>::~auto_array
            ((auto_array<float> *)CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  osc_state::~osc_state((osc_state *)CONCAT44(in_stack_fffffffffffffe84,initial_phase));
  return;
}

Assistant:

void test_resampler_duplex(uint32_t input_channels, uint32_t output_channels,
                           uint32_t input_rate, uint32_t output_rate,
                           uint32_t target_rate, float chunk_duration)
{
  cubeb_stream_params input_params;
  cubeb_stream_params output_params;
  osc_state state;

  input_params.format = output_params.format = cubeb_format<T>();
  state.input_channels = input_params.channels = input_channels;
  state.output_channels = output_params.channels = output_channels;
  input_params.rate = input_rate;
  state.output_rate = output_params.rate = output_rate;
  state.target_rate = target_rate;
  input_params.prefs = output_params.prefs = CUBEB_STREAM_PREF_NONE;
  long got;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, &output_params, target_rate,
                           data_cb_resampler, (void*)&state, CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  long latency = cubeb_resampler_latency(resampler);

  const uint32_t duration_s = 2;
  int32_t duration_frames = duration_s * target_rate;
  uint32_t input_array_frame_count = ceil(chunk_duration * input_rate / 1000) + ceilf(static_cast<float>(input_rate) / target_rate) * 2;
  uint32_t output_array_frame_count = chunk_duration * output_rate / 1000;
  auto_array<float> input_buffer(input_channels * input_array_frame_count);
  auto_array<float> output_buffer(output_channels * output_array_frame_count);
  auto_array<float> expected_resampled_input(input_channels * duration_frames);
  auto_array<float> expected_resampled_output(output_channels * output_rate * duration_s);

  state.max_output_phase_index = duration_s * target_rate;

  expected_resampled_input.push_silence(input_channels * duration_frames);
  expected_resampled_output.push_silence(output_channels * output_rate * duration_s);

  /* expected output is a 440Hz sine wave at 16kHz */
  fill_with_sine(expected_resampled_input.data() + latency,
                 target_rate, input_channels, duration_frames - latency, 0);
  /* expected output is a 440Hz sine wave at 32kHz */
  fill_with_sine(expected_resampled_output.data() + latency,
                 output_rate, output_channels, output_rate * duration_s - latency, 0);

  while (state.output_phase_index != state.max_output_phase_index) {
    uint32_t leftover_samples = input_buffer.length() * input_channels;
    input_buffer.reserve(input_array_frame_count);
    state.input_phase_index = fill_with_sine(input_buffer.data() + leftover_samples,
                                             input_rate,
                                             input_channels,
                                             input_array_frame_count - leftover_samples,
                                             state.input_phase_index);
    long input_consumed = input_array_frame_count;
    input_buffer.set_length(input_array_frame_count);

    got = cubeb_resampler_fill(resampler,
                               input_buffer.data(), &input_consumed,
                               output_buffer.data(), output_array_frame_count);

    /* handle leftover input */
    if (input_array_frame_count != static_cast<uint32_t>(input_consumed)) {
      input_buffer.pop(nullptr, input_consumed * input_channels);
    } else {
      input_buffer.clear();
    }

    state.output.push(output_buffer.data(), got * state.output_channels);
  }

  dump("input_expected.raw", expected_resampled_input.data(), expected_resampled_input.length());
  dump("output_expected.raw", expected_resampled_output.data(), expected_resampled_output.length());
  dump("input.raw", state.input.data(), state.input.length());
  dump("output.raw", state.output.data(), state.output.length());

 // This is disabled because the latency estimation in the resampler code is
 // slightly off so we can generate expected vectors.
 // See https://github.com/kinetiknz/cubeb/issues/93
 // ASSERT_TRUE(array_fuzzy_equal(state.input, expected_resampled_input, epsilon<T>(input_rate/target_rate)));
 // ASSERT_TRUE(array_fuzzy_equal(state.output, expected_resampled_output, epsilon<T>(output_rate/target_rate)));

  cubeb_resampler_destroy(resampler);
}